

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::NewDB(DBImpl *this)

{
  WritableFile *pWVar1;
  _func_int **pp_Var2;
  long in_RSI;
  Writer *this_00;
  WritableFile *file;
  undefined1 local_150 [8];
  DB local_148;
  size_type sStack_140;
  undefined1 local_138 [8];
  string manifest;
  string record;
  Writer log;
  VersionEdit new_db;
  
  VersionEdit::VersionEdit(&new_db);
  manifest._M_dataplus._M_p = (pointer)(**(code **)(**(long **)(in_RSI + 0x18) + 0x18))();
  manifest._M_string_length = strlen(manifest._M_dataplus._M_p);
  VersionEdit::SetComparatorName(&new_db,(Slice *)&manifest);
  new_db.has_log_number_ = true;
  new_db.log_number_ = 0;
  new_db.has_next_file_number_ = true;
  new_db.has_last_sequence_ = true;
  new_db.next_file_number_ = 2;
  new_db.last_sequence_ = 0;
  DescriptorFileName(&manifest,(string *)(in_RSI + 0x898),1);
  (**(code **)(**(long **)(in_RSI + 8) + 0x20))(this,*(long **)(in_RSI + 8),&manifest,&file);
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    leveldb::log::Writer::Writer(&log,file);
    record._M_dataplus._M_p = (pointer)&record.field_2;
    record._M_string_length = 0;
    record.field_2._M_local_buf[0] = '\0';
    VersionEdit::EncodeTo(&new_db,&record);
    local_148._vptr_DB = (_func_int **)record._M_dataplus._M_p;
    sStack_140 = record._M_string_length;
    leveldb::log::Writer::AddRecord((Writer *)local_138,(Slice *)&log);
    pWVar1 = (WritableFile *)(this->super_DB)._vptr_DB;
    (this->super_DB)._vptr_DB = (_func_int **)local_138;
    local_138 = (undefined1  [8])pWVar1;
    Status::~Status((Status *)local_138);
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      (*file->_vptr_WritableFile[3])(&local_148);
      pp_Var2 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = local_148._vptr_DB;
      local_148._vptr_DB = pp_Var2;
      Status::~Status((Status *)&local_148);
    }
    std::__cxx11::string::_M_dispose();
    leveldb::log::Writer::~Writer(&log);
    if (file != (WritableFile *)0x0) {
      (*file->_vptr_WritableFile[1])();
    }
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      this_00 = &log;
      SetCurrentFile((leveldb *)this_00,*(Env **)(in_RSI + 8),(string *)(in_RSI + 0x898),1);
      pWVar1 = (WritableFile *)(this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)log.dest_;
      log.dest_ = pWVar1;
    }
    else {
      this_00 = (Writer *)local_150;
      (**(code **)(**(long **)(in_RSI + 8) + 0x40))(this_00,*(long **)(in_RSI + 8),&manifest);
    }
    Status::~Status((Status *)this_00);
  }
  std::__cxx11::string::_M_dispose();
  VersionEdit::~VersionEdit(&new_db);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::NewDB() {
  VersionEdit new_db;
  new_db.SetComparatorName(user_comparator()->Name());
  new_db.SetLogNumber(0);
  new_db.SetNextFile(2);
  new_db.SetLastSequence(0);

  const std::string manifest = DescriptorFileName(dbname_, 1);
  WritableFile* file;
  Status s = env_->NewWritableFile(manifest, &file);
  if (!s.ok()) {
    return s;
  }
  {
    log::Writer log(file);
    std::string record;
    new_db.EncodeTo(&record);
    s = log.AddRecord(record);
    if (s.ok()) {
      s = file->Close();
    }
  }
  delete file;
  if (s.ok()) {
    // Make "CURRENT" file that points to the new manifest file.
    s = SetCurrentFile(env_, dbname_, 1);
  } else {
    env_->DeleteFile(manifest);
  }
  return s;
}